

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

void __thiscall
BVFixed::SetRange<Js::LoopFlags>(BVFixed *this,LoopFlags *value,BVIndex start,BVIndex len)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  sbyte sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  LoopFlags *pLVar9;
  BVFixed BVar10;
  ulong uVar11;
  BVIndex i;
  uint uVar12;
  undefined8 local_38;
  BVUnitTContainer temp;
  
  AssertRange(this,start);
  if (len != 0) {
    if (8 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xf2,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    i = (len + start) - 1;
    AssertRange(this,i);
    uVar6 = start >> 6;
    uVar7 = (ulong)uVar6;
    uVar8 = i >> 6;
    uVar12 = i & 0x3f;
    uVar4 = (ulong)(byte)*value;
    local_38 = (ulong)(byte)*value;
    sVar5 = (sbyte)(start & 0x3f);
    if (uVar8 == uVar6) {
      uVar11 = ~(-1L << ((char)(uVar12 + 1) - sVar5 & 0x3fU));
      if (uVar12 + 1 == 0x40) {
        uVar11 = 0xffffffffffffffff;
      }
      this[uVar7 + 1] =
           (BVFixed)((~(uVar11 << sVar5) | local_38 << sVar5) &
                    ((local_38 & uVar11) << sVar5 | (ulong)this[uVar7 + 1]));
      pLVar9 = (LoopFlags *)&local_38;
    }
    else if ((start & 0x3f) == 0) {
      uVar11 = (ulong)uVar8;
      pLVar9 = (LoopFlags *)&local_38;
      for (; uVar7 < uVar11; uVar7 = uVar7 + 1) {
        this[uVar7 + 1] = *(BVFixed *)pLVar9;
        pLVar9 = pLVar9 + 8;
      }
      uVar7 = ~(-1L << ((byte)(uVar12 + 1) & 0x3f));
      if (uVar12 + 1 == 0x40) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar4 = *(ulong *)pLVar9;
      this[uVar11 + 1] = (BVFixed)((~uVar7 | uVar4) & (uVar4 & uVar7 | (ulong)this[uVar11 + 1]));
    }
    else {
      this[(ulong)uVar6 + 1] =
           (BVFixed)(~(-1L << sVar5) & (ulong)this[(ulong)uVar6 + 1] | local_38 << sVar5);
      uVar4 = (ulong)uVar8;
      pLVar9 = (LoopFlags *)&temp;
      while( true ) {
        uVar11 = local_38 >> (0x40U - sVar5 & 0x3f);
        local_38 = *(ulong *)pLVar9;
        BVar10 = (BVFixed)(local_38 << sVar5 | uVar11);
        if (uVar4 <= uVar7 + 1) break;
        this[uVar7 + 2] = BVar10;
        pLVar9 = pLVar9 + 8;
        uVar7 = uVar7 + 1;
      }
      uVar7 = ~(-1L << ((byte)(uVar12 + 1) & 0x3f));
      if (uVar12 + 1 == 0x40) {
        uVar7 = 0xffffffffffffffff;
      }
      this[uVar4 + 1] =
           (BVFixed)((~uVar7 | (ulong)BVar10) & ((ulong)BVar10 & uVar7 | (ulong)this[uVar4 + 1]));
      uVar4 = local_38 & 0xffffffff;
    }
    local_38 = (long)(char)pLVar9[1] + (long)(char)uVar4;
    *value = *pLVar9;
  }
  return;
}

Assistant:

void BVFixed::SetRange(Container* value, BVIndex start, BVIndex len)
{
    AssertRange(start);
    if (len == 0)
    {
        return;
    }
    Assert(len <= sizeof(Container) * MachBits);
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);

    BVUnit::BVUnitTContainer temp;
    BVUnit::BVUnitTContainer* bits;
    static_assert(sizeof(Container) == 1 || sizeof(Container) == sizeof(BVUnit::BVUnitTContainer),
        "Container is not suitable to represent the calculated value");
    if (sizeof(Container) == 1)
    {
        static_assert(sizeof(byte) == 1, "Size of byte should be 1.");
        temp = *(byte*)value;
        bits = &temp;
    }
    else
    {
        bits = (BVUnit::BVUnitTContainer*)value;
    }
    const int oStartComplement = BVUnit::BitsPerWord - oStart;
    static_assert((BVUnit::BVUnitTContainer)BVUnit::AllOnesMask > 0, "Container type of BVFixed must be unsigned");
    //When making the mask, check the special case when we need all bits
#define MAKE_MASK(start, end) ( ((end) == BVUnit::BitsPerWord ? BVUnit::AllOnesMask : (((BVUnit::BVUnitTContainer)1 << ((end) - (start))) - 1))   << (start))
    // Or the value to set the bits to 1. And the value to set the bits to 0
    // The mask is used to make sure we don't modify the bits outside the range
#define SET_RANGE(i, value, mask) \
    this->data[i].Or((value) & mask);\
    this->data[i].And((value) | ~mask);

    BVUnit::BVUnitTContainer bitsToSet;
    // Fast Path
    if (iEnd == iStart)
    {
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, oEnd + 1);
        // Shift to position the bits
        bitsToSet = (*bits << oStart);
        SET_RANGE(iStart, bitsToSet, mask);
    }
    // TODO: case iEnd == iStart + 1 to avoid a loop
    else if (oStart == 0)
    {
        // Simpler case where we don't have to shift the bits around
        for (uint i = iStart; i < iEnd; ++i)
        {
            SET_RANGE(i, *bits, BVUnit::AllOnesMask);
            ++bits;
        }
        // We still need to use a mask to remove the unused bits
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
        SET_RANGE(iEnd, *bits, mask);
    }
    else
    {
        // Default case. We need to process everything 1 at a time
        {
            // First set the first bits
CLANG_WNO_BEGIN("-Wtautological-compare")
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, BVUnit::BitsPerWord);
CLANG_WNO_END
            SET_RANGE(iStart, *bits << oStart, mask);
        }
        // Set the bits in the middle
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            bitsToSet = *bits >> oStartComplement;
            ++bits;
            bitsToSet |= *bits << oStart;
            SET_RANGE(i, bitsToSet, BVUnit::AllOnesMask);
        }
        // Set the last bits
        bitsToSet = *bits >> oStartComplement;
        ++bits;
        bitsToSet |= *bits << oStart;
        {
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
            SET_RANGE(iEnd, bitsToSet, mask);
        }
    }

    if (sizeof(Container) == 1)
    {
        // Calculation above might overflow the original container.
        // normalize the overflow value. LE only
        temp = (*((char*)bits)) + (*(((char*)bits) + 1));
        memcpy(value, bits, 1);
    }
#undef MAKE_MASK
#undef SET_RANGE
}